

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void tetrahedralize(tetgenbehavior *b,tetgenio *in,tetgenio *out,tetgenio *addin,tetgenio *bgmin)

{
  double dVar1;
  long lVar2;
  int iVar3;
  clock_t cVar4;
  tetgenmesh *ptVar5;
  clock_t cVar6;
  clock_t cVar7;
  char *pcVar8;
  undefined4 uVar9;
  long local_658;
  clock_t local_650;
  clock_t local_648;
  clock_t local_640;
  tetgenmesh local_630;
  
  local_630.recentsh.sh = (shellface *)0x0;
  local_630.recentsh.shver = 0;
  local_630.highordertable = (point *)0x0;
  local_630.numpointattrib = 0;
  local_630.numelemattrib = 0;
  local_630.sizeoftensor = 0;
  local_630.pointmtrindex = 0;
  local_630.pointparamindex = 0;
  local_630.point2simindex = 0;
  local_630.pointmarkindex = 0;
  local_630.pointinsradiusindex = 0;
  local_630.elemattribindex = 0;
  local_630.volumeboundindex = 0;
  local_630.shmarkindex = 0;
  local_630.areaboundindex = 0;
  local_630.checksubsegflag = 0;
  local_630.checksubfaceflag = 0;
  local_630.checkconstraints = 0;
  local_630.nonconvex = 0;
  memset(&local_630.bgm,0,0x114);
  local_630.autofliplinklevel = 1;
  local_630.useinsertradius = 0;
  local_630.samples = 0;
  local_630.randomseed = 1;
  local_630.minfacetdihed = tetgenmesh::PI;
  local_630.minfaceang = tetgenmesh::PI;
  local_630.tetprism_vol_sum = 0.0;
  local_630.longest = 0.0;
  local_630.minedgelength = 0.0;
  local_630.xmax = 0.0;
  local_630.xmin = 0.0;
  local_630.ymax = 0.0;
  local_630.ymin = 0.0;
  local_630.zmax = 0.0;
  local_630.zmin = 0.0;
  local_630.insegments = 0;
  local_630.hullsize = 0;
  local_630.meshedges = 0;
  local_630.meshhulledges = 0;
  local_630.steinerleft = -1;
  memset(&local_630.dupverts,0,0x98);
  cVar4 = clock();
  local_630.in = in;
  local_630.addin = addin;
  local_630.b = b;
  if (((bgmin != (tetgenio *)0x0) && (b->metric != 0)) && (0 < bgmin->numberofpoints)) {
    ptVar5 = (tetgenmesh *)operator_new(0x600);
    (ptVar5->recentsh).sh = (shellface *)0x0;
    (ptVar5->recentsh).shver = 0;
    ptVar5->highordertable = (point *)0x0;
    ptVar5->numpointattrib = 0;
    ptVar5->numelemattrib = 0;
    ptVar5->sizeoftensor = 0;
    ptVar5->pointmtrindex = 0;
    ptVar5->pointparamindex = 0;
    ptVar5->point2simindex = 0;
    ptVar5->pointmarkindex = 0;
    ptVar5->pointinsradiusindex = 0;
    ptVar5->elemattribindex = 0;
    ptVar5->volumeboundindex = 0;
    ptVar5->shmarkindex = 0;
    ptVar5->areaboundindex = 0;
    ptVar5->checksubsegflag = 0;
    ptVar5->checksubfaceflag = 0;
    ptVar5->checkconstraints = 0;
    ptVar5->nonconvex = 0;
    memset(&ptVar5->addin,0,0x124);
    ptVar5->autofliplinklevel = 1;
    ptVar5->useinsertradius = 0;
    ptVar5->samples = 0;
    ptVar5->randomseed = 1;
    dVar1 = tetgenmesh::PI;
    ptVar5->minfacetdihed = tetgenmesh::PI;
    ptVar5->minfaceang = dVar1;
    ptVar5->meshhulledges = 0;
    ptVar5->hullsize = 0;
    ptVar5->meshedges = 0;
    ptVar5->zmin = 0.0;
    ptVar5->insegments = 0;
    ptVar5->ymin = 0.0;
    ptVar5->zmax = 0.0;
    ptVar5->xmin = 0.0;
    ptVar5->ymax = 0.0;
    ptVar5->minedgelength = 0.0;
    ptVar5->xmax = 0.0;
    ptVar5->tetprism_vol_sum = 0.0;
    ptVar5->longest = 0.0;
    ptVar5->steinerleft = -1;
    memset(&ptVar5->dupverts,0,0x98);
    ptVar5->b = b;
    ptVar5->in = bgmin;
    local_630.bgm = ptVar5;
  }
  tetgenmesh::initializepools(&local_630);
  tetgenmesh::transfernodes(&local_630);
  exactinit(b->verbose,b->noexact,b->nostaticfilter,local_630.xmax - local_630.xmin,
            local_630.ymax - local_630.ymin,local_630.zmax - local_630.zmin);
  cVar6 = clock();
  if (b->refine == 0) {
    tetgenmesh::incrementaldelaunay(&local_630,&local_658);
  }
  else {
    tetgenmesh::reconstructmesh(&local_630);
  }
  cVar7 = clock();
  if (b->quiet == 0) {
    uVar9 = SUB84((double)(cVar7 - cVar6) / 1000000.0,0);
    if (b->refine == 0) {
      printf("Delaunay seconds:  %g\n",uVar9);
      if (b->verbose == 0) goto LAB_001581cc;
      uVar9 = SUB84((double)(local_658 - cVar6) / 1000000.0,0);
      pcVar8 = "  Point sorting seconds:  %g\n";
    }
    else {
      pcVar8 = "Mesh reconstruction seconds:  %g\n";
    }
    printf(pcVar8,uVar9);
  }
LAB_001581cc:
  if ((b->plc != 0) && (b->refine == 0)) {
    tetgenmesh::meshsurface(&local_630);
    cVar6 = clock();
    local_658 = cVar6;
    if (b->quiet == 0) {
      printf("Surface mesh seconds:  %g\n",SUB84((double)(cVar6 - cVar7) / 1000000.0,0));
    }
    if (b->diagnose != 0) {
      tetgenmesh::detectinterfaces(&local_630);
      cVar4 = clock();
      if (b->quiet == 0) {
        printf("Self-intersection seconds:  %g\n",SUB84((double)(cVar4 - cVar6) / 1000000.0,0));
      }
      if (0 < (local_630.subfaces)->items) {
        tetgenmesh::outnodes(&local_630,out);
        tetgenmesh::outsubfaces(&local_630,out);
      }
      goto LAB_00158a13;
    }
  }
  cVar6 = clock();
  if (local_630.bgm != (tetgenmesh *)0x0 && b->metric != 0) {
    tetgenmesh::initializepools(local_630.bgm);
    tetgenmesh::transfernodes(local_630.bgm);
    tetgenmesh::reconstructmesh(local_630.bgm);
    cVar7 = clock();
    local_658 = cVar7;
    if (b->quiet == 0) {
      printf("Background mesh reconstruct seconds:  %g\n",
             SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
    }
    if (b->metric != 0) {
      tetgenmesh::interpolatemeshsize(&local_630);
      local_650 = clock();
      if (b->quiet == 0) {
        printf("Size interpolating seconds:  %g\n",SUB84((double)(local_650 - cVar7) / 1000000.0,0))
        ;
      }
    }
  }
  cVar6 = clock();
  if ((b->plc != 0) && (b->refine == 0)) {
    if (b->nobisect == 0) {
      tetgenmesh::constraineddelaunay(&local_630,&local_658);
    }
    else {
      tetgenmesh::recoverboundary(&local_630,&local_658);
    }
    cVar7 = clock();
    local_650 = cVar7;
    if (b->quiet == 0) {
      pcVar8 = "Boundary recovery ";
      if (b->nobisect == 0) {
        pcVar8 = "Constrained Delaunay ";
      }
      printf(pcVar8);
      printf("seconds:  %g\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
      lVar2 = local_658;
      if (b->verbose != 0) {
        printf("  Segment recovery seconds:  %g\n",SUB84((double)(local_658 - cVar6) / 1000000.0,0))
        ;
        printf("  Facet recovery seconds:  %g\n",SUB84((double)(cVar7 - lVar2) / 1000000.0,0));
      }
    }
    tetgenmesh::carveholes(&local_630);
    cVar6 = clock();
    local_648 = cVar6;
    if (b->quiet == 0) {
      printf("Exterior tets removal seconds:  %g\n",SUB84((double)(cVar6 - cVar7) / 1000000.0,0));
    }
    if ((b->nobisect != 0) && (0 < (local_630.subvertstack)->objects)) {
      tetgenmesh::suppresssteinerpoints(&local_630);
      local_640 = clock();
      if (b->quiet == 0) {
        printf("Steiner suppression seconds:  %g\n",SUB84((double)(local_640 - cVar6) / 1000000.0,0)
              );
      }
    }
  }
  cVar6 = clock();
  if (b->coarsen != 0) {
    tetgenmesh::meshcoarsening(&local_630);
  }
  cVar7 = clock();
  if ((b->quiet == 0) && (b->coarsen != 0)) {
    printf("Mesh coarsening seconds:  %g\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
  }
  if (((b->plc != 0) && (b->nobisect != 0)) || (b->coarsen != 0)) {
    tetgenmesh::recoverdelaunay(&local_630);
  }
  cVar6 = clock();
  iVar3 = b->plc;
  if ((b->quiet == 0) && (((iVar3 != 0 && (b->nobisect != 0)) || (b->coarsen != 0)))) {
    printf("Delaunay recovery seconds:  %g\n",SUB84((double)(cVar6 - cVar7) / 1000000.0,0));
    iVar3 = b->plc;
  }
  if (((iVar3 != 0) || (b->refine != 0)) &&
     ((addin != (tetgenio *)0x0 && ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    tetgenmesh::insertconstrainedpoints(&local_630,addin);
  }
  cVar7 = clock();
  if ((b->quiet == 0) &&
     ((((b->plc != 0 || (b->refine != 0)) && (addin != (tetgenio *)0x0)) &&
      ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    printf("Constrained points seconds:  %g\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
  }
  if (b->quality != 0) {
    tetgenmesh::delaunayrefinement(&local_630);
  }
  cVar6 = clock();
  if ((b->quiet == 0) && (b->quality != 0)) {
    printf("Refinement seconds:  %g\n",SUB84((double)(cVar6 - cVar7) / 1000000.0,0));
  }
  if (((b->plc != 0) || (b->refine != 0)) && (0 < b->optlevel)) {
    tetgenmesh::optimizemesh(&local_630);
  }
  cVar7 = clock();
  if (((b->quiet == 0) && ((b->plc != 0 || (b->refine != 0)))) && (0 < b->optlevel)) {
    printf("Optimization seconds:  %g\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
  }
  if ((b->nojettison == 0) &&
     (((0 < local_630.dupverts || (0 < local_630.unuverts)) ||
      ((b->refine != 0 && (in->numberofcorners == 10)))))) {
    tetgenmesh::jettisonnodes(&local_630);
  }
  if ((b->order == 2) && (b->convex == 0)) {
    tetgenmesh::highorder(&local_630);
  }
  if (b->quiet == 0) {
    putchar(10);
  }
  if (out != (tetgenio *)0x0) {
    iVar3 = in->mesh_dim;
    out->firstnumber = in->firstnumber;
    out->mesh_dim = iVar3;
  }
  if ((b->nonodewritten == 0) && (b->noiterationnum == 0)) {
    tetgenmesh::outnodes(&local_630,out);
  }
  else if (b->quiet == 0) {
    puts("NOT writing a .node file.");
  }
  if (b->noelewritten == 0) {
    if (0 < (local_630.tetrahedrons)->items) {
      tetgenmesh::outelements(&local_630,out);
    }
  }
  else {
    if (b->quiet == 0) {
      puts("NOT writing an .ele file.");
    }
    tetgenmesh::indexelements(&local_630);
  }
  if (b->nofacewritten == 0) {
    if (b->facesout == 0) {
      if ((b->plc == 0) && (b->refine == 0)) {
        if (0 < (local_630.tetrahedrons)->items) {
          tetgenmesh::outhullfaces(&local_630,out);
        }
      }
      else if (0 < (local_630.subfaces)->items) {
        tetgenmesh::outsubfaces(&local_630,out);
      }
    }
    else if (0 < (local_630.tetrahedrons)->items) {
      tetgenmesh::outfaces(&local_630,out);
    }
LAB_001586ef:
    if (b->nofacewritten != 0) {
      if (b->quiet == 0) {
        puts("NOT writing an .edge file.");
      }
      goto LAB_001588c0;
    }
    if (b->edgesout != 0) {
      tetgenmesh::outedges(&local_630,out);
      goto LAB_001588c0;
    }
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::outsubsegments(&local_630,out);
      goto LAB_001588c0;
    }
  }
  else {
    if (b->quiet == 0) {
      puts("NOT writing an .face file.");
      goto LAB_001586ef;
    }
LAB_001588c0:
    if (((b->plc != 0) || (b->refine != 0)) && (b->metric != 0)) {
      tetgenmesh::outmetrics(&local_630,out);
    }
  }
  if (out == (tetgenio *)0x0) {
    if ((b->plc != 0) && (b->object - OFF < 3)) {
      tetgenmesh::outsmesh(&local_630,b->outfilename);
    }
    if (b->meditview != 0) {
      tetgenmesh::outmesh2medit(&local_630,b->outfilename);
    }
    if (b->vtkview != 0) {
      tetgenmesh::outmesh2vtk(&local_630,b->outfilename);
    }
  }
  if (b->neighout != 0) {
    tetgenmesh::outneighbors(&local_630,out);
  }
  if (b->voroout != 0) {
    tetgenmesh::outvoronoi(&local_630,out);
  }
  cVar6 = clock();
  if (b->quiet == 0) {
    printf("\nOutput seconds:  %g\n",SUB84((double)(cVar6 - cVar7) / 1000000.0,0));
    printf("Total running seconds:  %g\n",SUB84((double)(cVar6 - cVar4) / 1000000.0,0));
  }
  if (b->docheck != 0) {
    tetgenmesh::checkmesh(&local_630,0);
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::checkshells(&local_630);
      tetgenmesh::checksegments(&local_630);
    }
    if (1 < b->docheck) {
      tetgenmesh::checkdelaunay(&local_630,1);
    }
  }
  if (b->quiet == 0) {
    tetgenmesh::statistics(&local_630);
  }
LAB_00158a13:
  tetgenmesh::freememory(&local_630);
  return;
}

Assistant:

void tetrahedralize(tetgenbehavior *b, tetgenio *in, tetgenio *out,
                    tetgenio *addin, tetgenio *bgmin)
{
  tetgenmesh m;
  clock_t tv[12], ts[5]; // Timing informations (defined in time.h)
  REAL cps = (REAL) CLOCKS_PER_SEC;

  tv[0] = clock();
 
  m.b = b;
  m.in = in;
  m.addin = addin;

  if (b->metric && bgmin && (bgmin->numberofpoints > 0)) {
    m.bgm = new tetgenmesh(); // Create an empty background mesh.
    m.bgm->b = b;
    m.bgm->in = bgmin;
  }

  m.initializepools();
  m.transfernodes();

  exactinit(b->verbose, b->noexact, b->nostaticfilter,
            m.xmax - m.xmin, m.ymax - m.ymin, m.zmax - m.zmin);

  tv[1] = clock();

  if (b->refine) { // -r
    m.reconstructmesh();
  } else { // -p
    m.incrementaldelaunay(ts[0]);
  }

  tv[2] = clock();

  if (!b->quiet) {
    if (b->refine) {
      printf("Mesh reconstruction seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
    } else {
      printf("Delaunay seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
      if (b->verbose) {
        printf("  Point sorting seconds:  %g\n", ((REAL)(ts[0]-tv[1])) / cps);
      }
    }
  }

  if (b->plc && !b->refine) { // -p
    m.meshsurface();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Surface mesh seconds:  %g\n", ((REAL)(ts[0]-tv[2])) / cps);
    }

    if (b->diagnose) { // -d
      m.detectinterfaces();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Self-intersection seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }

      // Only output when self-intersecting faces exist.
      if (m.subfaces->items > 0l) {
        m.outnodes(out);
        m.outsubfaces(out);
      }

      return;
    }
  }

  tv[3] = clock();

  if ((b->metric) && (m.bgm != NULL)) { // -m
    m.bgm->initializepools();
    m.bgm->transfernodes();
    m.bgm->reconstructmesh();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Background mesh reconstruct seconds:  %g\n",
             ((REAL)(ts[0] - tv[3])) / cps);
    }

    if (b->metric) { // -m
      m.interpolatemeshsize();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Size interpolating seconds:  %g\n",((REAL)(ts[1]-ts[0])) / cps);
      }
    }
  }

  tv[4] = clock();

  if (b->plc && !b->refine) { // -p
    if (b->nobisect) { // -Y
      m.recoverboundary(ts[0]);
    } else {
      m.constraineddelaunay(ts[0]);
    }

    ts[1] = clock();

    if (!b->quiet) {
      if (b->nobisect) {
        printf("Boundary recovery ");
      } else {
        printf("Constrained Delaunay ");
      }
      printf("seconds:  %g\n", ((REAL)(ts[1] - tv[4])) / cps);
      if (b->verbose) {
        printf("  Segment recovery seconds:  %g\n",((REAL)(ts[0]-tv[4]))/ cps);
        printf("  Facet recovery seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }
    }

    m.carveholes();

    ts[2] = clock();

    if (!b->quiet) {
      printf("Exterior tets removal seconds:  %g\n",((REAL)(ts[2]-ts[1]))/cps);
    }

    if (b->nobisect) { // -Y
      if (m.subvertstack->objects > 0l) {
        m.suppresssteinerpoints();

        ts[3] = clock();

        if (!b->quiet) {
          printf("Steiner suppression seconds:  %g\n",
                 ((REAL)(ts[3]-ts[2]))/cps);
        }
      }
    }
  }

  tv[5] = clock();

  if (b->coarsen) { // -R
    m.meshcoarsening();
  }

  tv[6] = clock();

  if (!b->quiet) {
    if (b->coarsen) {
      printf("Mesh coarsening seconds:  %g\n", ((REAL)(tv[6] - tv[5])) / cps);
    }
  }

  if ((b->plc && b->nobisect) || b->coarsen) {
    m.recoverdelaunay();
  }

  tv[7] = clock();

  if (!b->quiet) {
    if ((b->plc && b->nobisect) || b->coarsen) {
      printf("Delaunay recovery seconds:  %g\n", ((REAL)(tv[7] - tv[6]))/cps);
    }
  }

  if ((b->plc || b->refine) && b->insertaddpoints) { // -i
    if ((addin != NULL) && (addin->numberofpoints > 0)) {
      m.insertconstrainedpoints(addin); 
    }
  }

  tv[8] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && b->insertaddpoints) { // -i
      if ((addin != NULL) && (addin->numberofpoints > 0)) {
        printf("Constrained points seconds:  %g\n", ((REAL)(tv[8]-tv[7]))/cps);
      }
    }
  }

  if (b->quality) {
    m.delaunayrefinement();    
  }

  tv[9] = clock();

  if (!b->quiet) {
    if (b->quality) {
      printf("Refinement seconds:  %g\n", ((REAL)(tv[9] - tv[8])) / cps);
    }
  }

  if ((b->plc || b->refine) && (b->optlevel > 0)) {
    m.optimizemesh();
  }

  tv[10] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && (b->optlevel > 0)) {
      printf("Optimization seconds:  %g\n", ((REAL)(tv[10] - tv[9])) / cps);
    }
  }

  if (!b->nojettison && ((m.dupverts > 0) || (m.unuverts > 0)
      || (b->refine && (in->numberofcorners == 10)))) {
    m.jettisonnodes();
  }

  if ((b->order == 2) && !b->convex) {
    m.highorder();
  }

  if (!b->quiet) {
    printf("\n");
  }

  if (out != (tetgenio *) NULL) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }

  if (b->nonodewritten || b->noiterationnum) {
    if (!b->quiet) {
      printf("NOT writing a .node file.\n");
    }
  } else {
    m.outnodes(out);
  }

  if (b->noelewritten) {
    if (!b->quiet) {
      printf("NOT writing an .ele file.\n");
    }
    m.indexelements();
  } else {
    if (m.tetrahedrons->items > 0l) {
      m.outelements(out);
    }
  }

  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .face file.\n");
    }
  } else {
    if (b->facesout) {
      if (m.tetrahedrons->items > 0l) {
        m.outfaces(out);  // Output all faces.
      }
    } else {
      if (b->plc || b->refine) {
        if (m.subfaces->items > 0l) {
          m.outsubfaces(out); // Output boundary faces.
        }
      } else {
        if (m.tetrahedrons->items > 0l) {
          m.outhullfaces(out); // Output convex hull faces.
        }
      }
    }
  }


  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .edge file.\n");
    }
  } else {
    if (b->edgesout) { // -e
      m.outedges(out); // output all mesh edges. 
    } else {
      if (b->plc || b->refine) {
        m.outsubsegments(out); // output subsegments.
      }
    }
  }

  if ((b->plc || b->refine) && b->metric) { // -m
    m.outmetrics(out);
  }

  if (!out && b->plc && 
      ((b->object == tetgenbehavior::OFF) ||
       (b->object == tetgenbehavior::PLY) ||
       (b->object == tetgenbehavior::STL))) {
    m.outsmesh(b->outfilename);
  }

  if (!out && b->meditview) {
    m.outmesh2medit(b->outfilename); 
  }


  if (!out && b->vtkview) {
    m.outmesh2vtk(b->outfilename); 
  }

  if (b->neighout) {
    m.outneighbors(out);
  }

  if (b->voroout) {
    m.outvoronoi(out);
  }


  tv[11] = clock();

  if (!b->quiet) {
    printf("\nOutput seconds:  %g\n", ((REAL)(tv[11] - tv[10])) / cps);
    printf("Total running seconds:  %g\n", ((REAL)(tv[11] - tv[0])) / cps);
  }

  if (b->docheck) {
    m.checkmesh(0);
    if (b->plc || b->refine) {
      m.checkshells();
      m.checksegments();
    }
    if (b->docheck > 1) {
      m.checkdelaunay();
    }
  }

  if (!b->quiet) {
    m.statistics();
  }
}